

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O1

bool __thiscall
ELFIO::symbol_section_accessor_template<const_ELFIO::section>::generic_get_symbol<ELFIO::Elf32_Sym>
          (symbol_section_accessor_template<const_ELFIO::section> *this,Elf_Xword index,string *name
          ,Elf64_Addr *value,Elf_Xword *size,uchar *bind,uchar *type,Elf_Half *section_index,
          uchar *other)

{
  ushort uVar1;
  elfio *peVar2;
  elfio *peVar3;
  pointer puVar4;
  char *pcVar5;
  Elf_Word index_00;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  Elf_Xword EVar9;
  long lVar10;
  undefined4 extraout_var_01;
  char *__s;
  ushort uVar11;
  long lVar12;
  bool bVar13;
  string_section_accessor str_reader;
  __uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_> local_38;
  undefined4 extraout_var_00;
  
  iVar7 = (*this->symbol_section->_vptr_section[0x18])();
  if ((CONCAT44(extraout_var,iVar7) != 0) && (EVar9 = get_symbols_num(this), index < EVar9)) {
    iVar7 = (*this->symbol_section->_vptr_section[0x18])();
    lVar10 = CONCAT44(extraout_var_00,iVar7);
    iVar7 = (*this->symbol_section->_vptr_section[0xf])();
    lVar12 = CONCAT44(extraout_var_01,iVar7) * index;
    peVar2 = this->elf_file;
    uVar8 = (*this->symbol_section->_vptr_section[0xb])();
    peVar3 = (peVar2->sections).parent;
    puVar4 = (peVar3->sections_).
             super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(uVar8 & 0xffff) <
        (ulong)((long)(peVar3->sections_).
                      super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3)) {
      local_38._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
      super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
           *(tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_> *)
            &puVar4[uVar8 & 0xffff]._M_t;
    }
    else {
      local_38._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
      super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
           (tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_>)
           (_Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>)0x0;
    }
    uVar8 = *(uint *)(lVar10 + lVar12);
    index_00 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    if ((peVar2->convertor).need_conversion == false) {
      index_00 = uVar8;
    }
    __s = string_section_accessor_template<ELFIO::section>::get_string
                    ((string_section_accessor_template<ELFIO::section> *)&local_38,index_00);
    if (__s != (char *)0x0) {
      pcVar5 = (char *)name->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)name,0,pcVar5,(ulong)__s);
    }
    uVar8 = *(uint *)(lVar10 + 4 + lVar12);
    bVar13 = (peVar2->convertor).need_conversion == false;
    uVar6 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    if (bVar13) {
      uVar6 = uVar8;
    }
    *value = (ulong)uVar6;
    uVar8 = *(uint *)(lVar10 + 8 + lVar12);
    uVar6 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    if (bVar13) {
      uVar6 = uVar8;
    }
    *size = (ulong)uVar6;
    *bind = *(byte *)(lVar10 + 0xc + lVar12) >> 4;
    *type = *(byte *)(lVar10 + 0xc + lVar12) & 0xf;
    uVar1 = *(ushort *)(lVar10 + 0xe + lVar12);
    uVar11 = uVar1 << 8 | uVar1 >> 8;
    if ((peVar2->convertor).need_conversion == false) {
      uVar11 = uVar1;
    }
    *section_index = uVar11;
    *other = *(uchar *)(lVar10 + 0xd + lVar12);
    return true;
  }
  return false;
}

Assistant:

bool generic_get_symbol( Elf_Xword      index,
                             std::string&   name,
                             Elf64_Addr&    value,
                             Elf_Xword&     size,
                             unsigned char& bind,
                             unsigned char& type,
                             Elf_Half&      section_index,
                             unsigned char& other ) const
    {
        bool ret = false;

        if ( nullptr != symbol_section->get_data() &&
             index < get_symbols_num() ) {
            const auto* pSym = reinterpret_cast<const T*>(
                symbol_section->get_data() +
                index * symbol_section->get_entry_size() );

            const endianness_convertor& convertor = elf_file.get_convertor();

            section* string_section =
                elf_file.sections[get_string_table_index()];
            string_section_accessor str_reader( string_section );
            const char*             pStr =
                str_reader.get_string( convertor( pSym->st_name ) );
            if ( nullptr != pStr ) {
                name = pStr;
            }
            value         = convertor( pSym->st_value );
            size          = convertor( pSym->st_size );
            bind          = ELF_ST_BIND( pSym->st_info );
            type          = ELF_ST_TYPE( pSym->st_info );
            section_index = convertor( pSym->st_shndx );
            other         = pSym->st_other;

            ret = true;
        }

        return ret;
    }